

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14174cb::SADSkipx4Test_UnalignedRef_Test::TestBody
          (SADSkipx4Test_UnalignedRef_Test *this)

{
  uint8_t *in_RDI;
  int tmp_stride;
  SADSkipx4Test *in_stack_00000040;
  undefined8 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  uVar2 = *(undefined4 *)(in_RDI + 0x34);
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + -1;
  SADTestBase::FillRandom((SADTestBase *)CONCAT44(uVar2,in_stack_fffffffffffffff0),in_RDI,iVar1);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,0);
  SADTestBase::FillRandom((SADTestBase *)CONCAT44(uVar2,in_stack_fffffffffffffff0),in_RDI,iVar1);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,1);
  SADTestBase::FillRandom((SADTestBase *)CONCAT44(uVar2,in_stack_fffffffffffffff0),in_RDI,iVar1);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,2);
  SADTestBase::FillRandom((SADTestBase *)CONCAT44(uVar2,in_stack_fffffffffffffff0),in_RDI,iVar1);
  iVar1 = (int)((ulong)(in_RDI + 8) >> 0x20);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,3);
  SADTestBase::FillRandom((SADTestBase *)CONCAT44(uVar2,in_stack_fffffffffffffff0),in_RDI,iVar1);
  SADSkipx4Test::CheckSADs(in_stack_00000040);
  *(undefined4 *)(in_RDI + 0x34) = uVar2;
  return;
}

Assistant:

TEST_P(SADSkipx4Test, UnalignedRef) {
  // The reference frame, but not the source frame, may be unaligned for
  // certain types of searches.
  int tmp_stride = reference_stride_;
  reference_stride_ -= 1;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  reference_stride_ = tmp_stride;
}